

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

void AnalyzeClassStaticIf
               (ExpressionContext *ctx,ExprClassDefinition *classDefinition,SynClassStaticIf *syntax
               ,bool baseElements)

{
  ExprBase *pEVar1;
  ExprBoolLiteral *pEVar2;
  ExprBoolLiteral *number;
  ExprBase *condition;
  bool baseElements_local;
  SynClassStaticIf *syntax_local;
  ExprClassDefinition *classDefinition_local;
  ExpressionContext *ctx_local;
  
  pEVar1 = AnalyzeExpression(ctx,syntax->condition);
  pEVar1 = CreateConditionCast(ctx,pEVar1->source,pEVar1);
  pEVar1 = CreateCast(ctx,&syntax->super_SynBase,pEVar1,ctx->typeBool,false);
  pEVar1 = anon_unknown.dwarf_6f1cc::EvaluateExpression(ctx,&syntax->super_SynBase,pEVar1);
  pEVar2 = getType<ExprBoolLiteral>(pEVar1);
  if (pEVar2 == (ExprBoolLiteral *)0x0) {
    anon_unknown.dwarf_6f1cc::Report(ctx,&syntax->super_SynBase,"ERROR: can\'t get condition value")
    ;
  }
  else if (((pEVar2->super_ExprBase).field_0x29 & 1) == 0) {
    if (syntax->falseBlock != (SynClassElements *)0x0) {
      if (baseElements) {
        AnalyzeClassBaseElements(ctx,classDefinition,syntax->falseBlock);
      }
      else {
        AnalyzeClassFunctionElements(ctx,classDefinition,syntax->falseBlock);
      }
    }
  }
  else if (baseElements) {
    AnalyzeClassBaseElements(ctx,classDefinition,syntax->trueBlock);
  }
  else {
    AnalyzeClassFunctionElements(ctx,classDefinition,syntax->trueBlock);
  }
  return;
}

Assistant:

void AnalyzeClassStaticIf(ExpressionContext &ctx, ExprClassDefinition *classDefinition, SynClassStaticIf *syntax, bool baseElements)
{
	ExprBase *condition = AnalyzeExpression(ctx, syntax->condition);

	condition = CreateConditionCast(ctx, condition->source, condition);

	if(ExprBoolLiteral *number = getType<ExprBoolLiteral>(EvaluateExpression(ctx, syntax, CreateCast(ctx, syntax, condition, ctx.typeBool, false))))
	{
		if(number->value)
		{
			if(baseElements)
				AnalyzeClassBaseElements(ctx, classDefinition, syntax->trueBlock);
			else
				AnalyzeClassFunctionElements(ctx, classDefinition, syntax->trueBlock);
		}
		else if(syntax->falseBlock)
		{
			if(baseElements)
				AnalyzeClassBaseElements(ctx, classDefinition, syntax->falseBlock);
			else
				AnalyzeClassFunctionElements(ctx, classDefinition, syntax->falseBlock);
		}
	}
	else
	{
		Report(ctx, syntax, "ERROR: can't get condition value");
	}
}